

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O2

void Saig_ManExplorePaths_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int f,int fMax,Vec_Ptr_t *vSimInfo)

{
  Vec_Ptr_t *p_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  long lVar4;
  
  do {
    while( true ) {
      uVar1 = Saig_ManSimInfo2Get(vSimInfo,pObj,f);
      if (1 < uVar1) {
        return;
      }
      Saig_ManSetAndDriveImplications_rec(p,pObj,f,fMax,vSimInfo);
      iVar2 = Aig_ObjIsConst1(pObj);
      if (iVar2 != 0) {
        __assert_fail("!Aig_ObjIsConst1(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                      ,0x153,
                      "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                     );
      }
      iVar2 = Saig_ObjIsLo(p,pObj);
      if ((f == 0) && (iVar2 != 0)) {
        return;
      }
      if (((*(uint *)&pObj->field_0x18 & 7) == 2) &&
         (iVar2 = Aig_ObjCioId(pObj), iVar2 < p->nTruePis)) {
        iVar3 = Aig_ObjCioId(pObj);
        for (iVar2 = fMax; -1 < iVar2; iVar2 = iVar2 + -1) {
          if (f != iVar2) {
            pObj_00 = Aig_ManCi(p,iVar3);
            Saig_ManSetAndDriveImplications_rec(p,pObj_00,iVar2,fMax,vSimInfo);
          }
        }
        return;
      }
      iVar2 = Saig_ObjIsLo(p,pObj);
      if (iVar2 != 0) break;
      uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
      lVar4 = 8;
      if ((uVar1 & 7) != 3) {
        if ((uVar1 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                        ,0x16a,
                        "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                       );
        }
        Saig_ManExplorePaths_rec
                  (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f,fMax,vSimInfo);
        lVar4 = 0x10;
      }
      pObj = (Aig_Obj_t *)(*(ulong *)((long)&pObj->field_0 + lVar4) & 0xfffffffffffffffe);
    }
    if (f < 1) {
      __assert_fail("f > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                    ,0x161,
                    "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                   );
    }
    iVar2 = Saig_ObjIsLo(p,pObj);
    if (iVar2 == 0) {
      __assert_fail("Saig_ObjIsLo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                    ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
    }
    p_00 = p->vCos;
    iVar2 = p->nTruePos;
    iVar3 = Aig_ObjCioId(pObj);
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,(iVar2 + iVar3) - p->nTruePis);
    f = f + -1;
  } while( true );
}

Assistant:

void Saig_ManExplorePaths_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int f, int fMax, Vec_Ptr_t * vSimInfo )
{
    int Value = Saig_ManSimInfo2Get( vSimInfo, pObj, f );
    if ( Saig_ManSimInfo2IsOld( Value ) )
        return;
    Saig_ManSetAndDriveImplications_rec( p, pObj, f, fMax, vSimInfo );
    assert( !Aig_ObjIsConst1(pObj) );
    if ( Saig_ObjIsLo(p, pObj) && f == 0 )
        return;
    if ( Saig_ObjIsPi(p, pObj) )
    {
        // propagate implications of this assignment
        int i, iPiNum = Aig_ObjCioId(pObj);
        for ( i = fMax; i >= 0; i-- )
            if ( i != f )
                Saig_ManSetAndDriveImplications_rec( p, Aig_ManCi(p, iPiNum), i, fMax, vSimInfo );
        return;
    }
    if ( Saig_ObjIsLo( p, pObj ) )
    {
        assert( f > 0 );
        Saig_ManExplorePaths_rec( p, Saig_ObjLoToLi(p, pObj), f-1, fMax, vSimInfo );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( Value == SAIG_ZER_OLD )
    {
//        if ( (Aig_ObjId(pObj) & 1) == 0 )
            Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
//        else
//            Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
    else
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
}